

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_compress.c
# Opt level: O1

size_t libdeflate_gzip_compress
                 (libdeflate_compressor *c,void *in,size_t in_nbytes,void *out,
                 size_t out_nbytes_avail)

{
  uint uVar1;
  uint32_t uVar2;
  size_t sVar3;
  char cVar4;
  
  if (0x12 < out_nbytes_avail) {
    *(undefined8 *)out = 0x88b1f;
    uVar1 = libdeflate_get_compression_level(c);
    cVar4 = '\x04';
    if (1 < uVar1) {
      cVar4 = (7 < uVar1) * '\x02';
    }
    *(char *)((long)out + 8) = cVar4;
    *(undefined1 *)((long)out + 9) = 0xff;
    sVar3 = libdeflate_deflate_compress
                      (c,in,in_nbytes,(void *)((long)out + 10),out_nbytes_avail - 0x12);
    if (sVar3 != 0) {
      uVar2 = libdeflate_crc32(0,in,in_nbytes);
      *(uint32_t *)((long)out + sVar3 + 10) = uVar2;
      *(int *)((long)out + sVar3 + 0xe) = (int)in_nbytes;
      return (long)out + 10 + (sVar3 - (long)out) + 8;
    }
  }
  return 0;
}

Assistant:

LIBDEFLATEAPI size_t
libdeflate_gzip_compress(struct libdeflate_compressor *c,
			 const void *in, size_t in_nbytes,
			 void *out, size_t out_nbytes_avail)
{
	u8 *out_next = out;
	unsigned compression_level;
	u8 xfl;
	size_t deflate_size;

	if (out_nbytes_avail <= GZIP_MIN_OVERHEAD)
		return 0;

	/* ID1 */
	*out_next++ = GZIP_ID1;
	/* ID2 */
	*out_next++ = GZIP_ID2;
	/* CM */
	*out_next++ = GZIP_CM_DEFLATE;
	/* FLG */
	*out_next++ = 0;
	/* MTIME */
	put_unaligned_le32(GZIP_MTIME_UNAVAILABLE, out_next);
	out_next += 4;
	/* XFL */
	xfl = 0;
	compression_level = libdeflate_get_compression_level(c);
	if (compression_level < 2)
		xfl |= GZIP_XFL_FASTEST_COMPRESSION;
	else if (compression_level >= 8)
		xfl |= GZIP_XFL_SLOWEST_COMPRESSION;
	*out_next++ = xfl;
	/* OS */
	*out_next++ = GZIP_OS_UNKNOWN;	/* OS  */

	/* Compressed data  */
	deflate_size = libdeflate_deflate_compress(c, in, in_nbytes, out_next,
					out_nbytes_avail - GZIP_MIN_OVERHEAD);
	if (deflate_size == 0)
		return 0;
	out_next += deflate_size;

	/* CRC32 */
	put_unaligned_le32(libdeflate_crc32(0, in, in_nbytes), out_next);
	out_next += 4;

	/* ISIZE */
	put_unaligned_le32((u32)in_nbytes, out_next);
	out_next += 4;

	return out_next - (u8 *)out;
}